

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O0

bool __thiscall
density::
conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>_>
::consume_operation::start_consume_impl
          (consume_operation *this,PrivateType param_1,
          conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>_>
          *i_queue)

{
  bool bVar1;
  undefined1 local_30 [7];
  bool result;
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>_>
  *local_20;
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>_>
  *i_queue_local;
  consume_operation *pcStack_10;
  PrivateType param_1_local;
  consume_operation *this_local;
  
  local_20 = i_queue;
  i_queue_local._4_4_ = param_1;
  pcStack_10 = this;
  bVar1 = std::unique_lock<std::mutex>::owns_lock(&this->m_lock);
  if (bVar1) {
    cancel(this);
  }
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&local_20->m_mutex);
  std::unique_lock<std::mutex>::operator=(&this->m_lock,(unique_lock<std::mutex> *)local_30);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  bVar1 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>_>
          ::try_start_consume(&local_20->m_queue,&this->m_consume_operation);
  if (!bVar1) {
    std::unique_lock<std::mutex>::unlock(&this->m_lock);
  }
  return bVar1;
}

Assistant:

bool start_consume_impl(PrivateType, conc_heter_queue * i_queue)
            {
                if (m_lock.owns_lock())
                    cancel();

                m_lock = std::unique_lock<std::mutex>(i_queue->m_mutex);

                bool const result = i_queue->m_queue.try_start_consume(m_consume_operation);
                if (!result)
                    m_lock.unlock();
                return result;
            }